

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O2

bool check_div_uint32_int32(uint32_t a,int32_t b,uint32_t *ret)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = false;
  uVar2 = 0;
  if (b != 0) {
    if (a != 0) {
      if (b < 1) {
        uVar2 = 0;
        if ((uint)-b <= a) {
          return false;
        }
      }
      else {
        uVar2 = a / (uint)b;
      }
    }
    *ret = uVar2;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static inline bool check_div_uint32_int32(uint32_t a, int32_t b, uint32_t* ret)
{
    // Follow original SafeInt logic for this case
    if (b == 0) // div 0 always a problem
    {
        return false;
    }

    if (a == 0) // zero divided by anything is zero
    {
        *ret = 0;
        return true;
    }

    if (b > 0) // if b is positive, just do the math
    {
        *ret = (a / (uint32_t)b);
        return true;
    }
    else // now have to check magnitude
    {
        uint32_t tmp = safe_abs32(b);

        if (a < tmp)
        {
            *ret = 0;
            return true;
        }
    }

    return false;
}